

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall spdlog::details::scoped_padder::~scoped_padder(scoped_padder *this)

{
  long count;
  memory_buf_t *pmVar1;
  ulong uVar2;
  
  count = this->remaining_pad_;
  if (count < 0) {
    if (this->padinfo_->truncate_ == true) {
      pmVar1 = this->dest_;
      uVar2 = count + (pmVar1->super_buffer<char>).size_;
      if ((pmVar1->super_buffer<char>).capacity_ < uVar2) {
        (**(pmVar1->super_buffer<char>)._vptr_buffer)(pmVar1,uVar2);
      }
      (pmVar1->super_buffer<char>).size_ = uVar2;
    }
  }
  else {
    pad_it(this,count);
  }
  return;
}

Assistant:

~scoped_padder()
    {
        if (remaining_pad_ >= 0)
        {
            pad_it(remaining_pad_);
        }
        else if (padinfo_.truncate_)
        {
            long new_size = static_cast<long>(dest_.size()) + remaining_pad_;
            dest_.resize(static_cast<size_t>(new_size));
        }
    }